

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketLip.cpp
# Opt level: O2

void __thiscall SslUdpSocket::SslUdpSocket(SslUdpSocket *this)

{
  BaseSocketImpl *pBVar1;
  _Head_base<0UL,_BaseSocketImpl_*,_false> _Var2;
  _Head_base<0UL,_BaseSocketImpl_*,_false> local_20;
  SslUdpSocket *local_18;
  
  UdpSocket::UdpSocket(&this->super_UdpSocket);
  (this->super_UdpSocket).super_BaseSocket._vptr_BaseSocket =
       (_func_int **)&PTR__BaseSocket_00144bf0;
  local_18 = this;
  std::make_unique<SslUdpSocketImpl,SslUdpSocket*>((SslUdpSocket **)&local_20);
  _Var2._M_head_impl = local_20._M_head_impl;
  local_20._M_head_impl = (BaseSocketImpl *)0x0;
  pBVar1 = (this->super_UdpSocket).super_BaseSocket.Impl_._M_t.
           super___uniq_ptr_impl<BaseSocketImpl,_std::default_delete<BaseSocketImpl>_>._M_t.
           super__Tuple_impl<0UL,_BaseSocketImpl_*,_std::default_delete<BaseSocketImpl>_>.
           super__Head_base<0UL,_BaseSocketImpl_*,_false>._M_head_impl;
  (this->super_UdpSocket).super_BaseSocket.Impl_._M_t.
  super___uniq_ptr_impl<BaseSocketImpl,_std::default_delete<BaseSocketImpl>_>._M_t.
  super__Tuple_impl<0UL,_BaseSocketImpl_*,_std::default_delete<BaseSocketImpl>_>.
  super__Head_base<0UL,_BaseSocketImpl_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (pBVar1 != (BaseSocketImpl *)0x0) {
    (*pBVar1->_vptr_BaseSocketImpl[1])();
    if (local_20._M_head_impl != (BaseSocketImpl *)0x0) {
      (*(local_20._M_head_impl)->_vptr_BaseSocketImpl[1])();
    }
  }
  return;
}

Assistant:

SslUdpSocket::SslUdpSocket()
{
    Impl_ = make_unique<SslUdpSocketImpl>(this);
}